

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O0

string * __thiscall Form::toStringSimple_abi_cxx11_(Form *this)

{
  string *in_RDI;
  string *in_stack_00000018;
  Form *in_stack_00000020;
  string *result;
  
  std::__cxx11::string::string(in_RDI);
  buildStringSimple(in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

std::string Form::toStringSimple() {
  std::string result;
  buildStringSimple(result);
  return result;
}